

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UnicodeSetStringSpan::span
          (UnicodeSetStringSpan *this,UChar *s,int32_t length,USetSpanCondition spanCondition)

{
  UnicodeSet *this_00;
  byte bVar1;
  short sVar2;
  uint uVar3;
  long lVar4;
  UBool *pUVar5;
  uint uVar6;
  uint uVar7;
  UBool UVar8;
  int iVar9;
  int32_t iVar10;
  UnicodeString *pUVar11;
  char16_t *pcVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int length_00;
  uint uVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  uint local_b0;
  int32_t maxInc;
  int32_t local_a8;
  OffsetList offsets;
  
  if (spanCondition == USET_SPAN_NOT_CONTAINED) {
    iVar10 = spanNot(this,s,length);
    return iVar10;
  }
  this_00 = &this->spanSet;
  local_b0 = UnicodeSet::span(this_00,s,length,USET_SPAN_CONTAINED);
  length_00 = length - local_b0;
  if (length_00 == 0) {
    return length;
  }
  offsets.list = offsets.staticList;
  offsets.capacity = 0;
  offsets.length = 0;
  offsets.start = 0;
  if (spanCondition == USET_SPAN_CONTAINED) {
    OffsetList::setMaxLength(&offsets,this->maxLength16);
  }
  uVar3 = this->strings->count;
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  maxInc = local_b0;
  do {
    local_a8 = length;
    if (spanCondition == USET_SPAN_CONTAINED) {
      for (uVar13 = 0; uVar13 != uVar3; uVar13 = uVar13 + 1) {
        bVar1 = this->spanLengths[uVar13];
        if (bVar1 != 0xff) {
          pUVar11 = (UnicodeString *)UVector::elementAt(this->strings,(int32_t)uVar13);
          pcVar12 = UnicodeString::getBuffer(pUVar11);
          sVar2 = (pUVar11->fUnion).fStackFields.fLengthAndFlags;
          if (sVar2 < 0) {
            uVar16 = (pUVar11->fUnion).fFields.fLength;
          }
          else {
            uVar16 = (int)sVar2 >> 5;
          }
          uVar14 = (uint)bVar1;
          if ((((bVar1 == 0xfe) && (uVar14 = uVar16 - 1, 1 < (int)uVar16)) &&
              ((pcVar12[(long)(int)uVar16 + -1] & 0xfc00U) == 0xdc00)) &&
             ((pcVar12[(ulong)uVar16 - 2] & 0xfc00U) == 0xd800)) {
            uVar14 = uVar16 - 2;
          }
          uVar18 = local_b0;
          if ((int)uVar14 < (int)local_b0) {
            uVar18 = uVar14;
          }
          iVar15 = uVar16 - uVar18;
          if ((int)local_b0 <= (int)uVar14) {
            uVar14 = local_b0;
          }
          for (lVar19 = 0; pUVar5 = offsets.list, uVar20 = (uint)lVar19,
              (int)(iVar15 + uVar20) <= length_00; lVar19 = lVar19 + 1) {
            iVar9 = 0;
            if (offsets.capacity <= (int)(offsets.start + iVar15 + uVar20)) {
              iVar9 = offsets.capacity;
            }
            lVar4 = (long)iVar15 + ((long)offsets.start - (long)iVar9);
            if ((offsets.list[lVar19 + lVar4] == '\0') &&
               (UVar8 = matches16CPB(s,(maxInc - uVar18) + uVar20,length,pcVar12,uVar16),
               UVar8 != '\0')) {
              if ((uVar18 + length_00) - uVar16 == uVar20) goto LAB_002ac0d5;
              pUVar5[lVar19 + lVar4] = '\x01';
              offsets.length = offsets.length + 1;
            }
            if (uVar14 == uVar20) break;
          }
        }
      }
LAB_002ac005:
      if ((local_b0 == 0) && (maxInc != 0)) {
        if (offsets.length == 0) {
          uVar16 = UnicodeSet::span(this_00,s + maxInc,length_00,USET_SPAN_CONTAINED);
          length_00 = length_00 - uVar16;
          if ((length_00 != 0) && (local_b0 = uVar16, uVar16 != 0)) goto LAB_002ac07b;
          local_a8 = uVar16 + maxInc;
          goto LAB_002ac0d5;
        }
        uVar16 = spanOne(this_00,s + maxInc,length_00);
        if ((int)uVar16 < 1) goto LAB_002ac05f;
        length_00 = length_00 - uVar16;
        if (length_00 == 0) goto LAB_002ac0d5;
        OffsetList::shift(&offsets,uVar16);
      }
      else {
        if (offsets.length == 0) {
          local_a8 = maxInc;
LAB_002ac0d5:
          OffsetList::~OffsetList(&offsets);
          return local_a8;
        }
LAB_002ac05f:
        uVar16 = OffsetList::popMinimum(&offsets);
        length_00 = length_00 - uVar16;
      }
      local_b0 = 0;
    }
    else {
      uVar16 = 0;
      uVar14 = 0;
      for (uVar13 = 0; uVar13 != uVar3; uVar13 = uVar13 + 1) {
        bVar1 = this->spanLengths[uVar13];
        pUVar11 = (UnicodeString *)UVector::elementAt(this->strings,(int32_t)uVar13);
        pcVar12 = UnicodeString::getBuffer(pUVar11);
        sVar2 = (pUVar11->fUnion).fStackFields.fLengthAndFlags;
        if (sVar2 < 0) {
          uVar18 = (pUVar11->fUnion).fFields.fLength;
        }
        else {
          uVar18 = (int)sVar2 >> 5;
        }
        uVar20 = (uint)bVar1;
        if (0xfd < bVar1) {
          uVar20 = uVar18;
        }
        if ((int)local_b0 <= (int)uVar20) {
          uVar20 = local_b0;
        }
        uVar17 = uVar18 - uVar20;
        iVar15 = maxInc - uVar20;
        while (((uVar6 = uVar14, uVar7 = uVar16, (int)uVar17 <= length_00 &&
                ((int)uVar14 <= (int)uVar20)) &&
               ((((int)uVar20 <= (int)uVar14 && ((int)uVar17 <= (int)uVar16)) ||
                (UVar8 = matches16CPB(s,iVar15,length,pcVar12,uVar18), uVar6 = uVar20,
                uVar7 = uVar17, UVar8 == '\0'))))) {
          uVar20 = uVar20 - 1;
          uVar17 = uVar17 + 1;
          iVar15 = iVar15 + 1;
        }
        uVar16 = uVar7;
        uVar14 = uVar6;
      }
      if (uVar14 == 0 && uVar16 == 0) goto LAB_002ac005;
      local_b0 = 0;
      length_00 = length_00 - uVar16;
      if (length_00 == 0) goto LAB_002ac0d5;
    }
LAB_002ac07b:
    maxInc = maxInc + uVar16;
  } while( true );
}

Assistant:

int32_t UnicodeSetStringSpan::span(const UChar *s, int32_t length, USetSpanCondition spanCondition) const {
    if(spanCondition==USET_SPAN_NOT_CONTAINED) {
        return spanNot(s, length);
    }
    int32_t spanLength=spanSet.span(s, length, USET_SPAN_CONTAINED);
    if(spanLength==length) {
        return length;
    }

    // Consider strings; they may overlap with the span.
    OffsetList offsets;
    if(spanCondition==USET_SPAN_CONTAINED) {
        // Use offset list to try all possibilities.
        offsets.setMaxLength(maxLength16);
    }
    int32_t pos=spanLength, rest=length-pos;
    int32_t i, stringsLength=strings.size();
    for(;;) {
        if(spanCondition==USET_SPAN_CONTAINED) {
            for(i=0; i<stringsLength; ++i) {
                int32_t overlap=spanLengths[i];
                if(overlap==ALL_CP_CONTAINED) {
                    continue;  // Irrelevant string.
                }
                const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
                const UChar *s16=string.getBuffer();
                int32_t length16=string.length();

                // Try to match this string at pos-overlap..pos.
                if(overlap>=LONG_SPAN) {
                    overlap=length16;
                    // While contained: No point matching fully inside the code point span.
                    U16_BACK_1(s16, 0, overlap);  // Length of the string minus the last code point.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t inc=length16-overlap;  // Keep overlap+inc==length16.
                for(;;) {
                    if(inc>rest) {
                        break;
                    }
                    // Try to match if the increment is not listed already.
                    if(!offsets.containsOffset(inc) && matches16CPB(s, pos-overlap, length, s16, length16)) {
                        if(inc==rest) {
                            return length;  // Reached the end of the string.
                        }
                        offsets.addOffset(inc);
                    }
                    if(overlap==0) {
                        break;
                    }
                    --overlap;
                    ++inc;
                }
            }
        } else /* USET_SPAN_SIMPLE */ {
            int32_t maxInc=0, maxOverlap=0;
            for(i=0; i<stringsLength; ++i) {
                int32_t overlap=spanLengths[i];
                // For longest match, we do need to try to match even an all-contained string
                // to find the match from the earliest start.

                const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
                const UChar *s16=string.getBuffer();
                int32_t length16=string.length();

                // Try to match this string at pos-overlap..pos.
                if(overlap>=LONG_SPAN) {
                    overlap=length16;
                    // Longest match: Need to match fully inside the code point span
                    // to find the match from the earliest start.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t inc=length16-overlap;  // Keep overlap+inc==length16.
                for(;;) {
                    if(inc>rest || overlap<maxOverlap) {
                        break;
                    }
                    // Try to match if the string is longer or starts earlier.
                    if( (overlap>maxOverlap || /* redundant overlap==maxOverlap && */ inc>maxInc) &&
                        matches16CPB(s, pos-overlap, length, s16, length16)
                    ) {
                        maxInc=inc;  // Longest match from earliest start.
                        maxOverlap=overlap;
                        break;
                    }
                    --overlap;
                    ++inc;
                }
            }

            if(maxInc!=0 || maxOverlap!=0) {
                // Longest-match algorithm, and there was a string match.
                // Simply continue after it.
                pos+=maxInc;
                rest-=maxInc;
                if(rest==0) {
                    return length;  // Reached the end of the string.
                }
                spanLength=0;  // Match strings from after a string match.
                continue;
            }
        }
        // Finished trying to match all strings at pos.

        if(spanLength!=0 || pos==0) {
            // The position is after an unlimited code point span (spanLength!=0),
            // not after a string match.
            // The only position where spanLength==0 after a span is pos==0.
            // Otherwise, an unlimited code point span is only tried again when no
            // strings match, and if such a non-initial span fails we stop.
            if(offsets.isEmpty()) {
                return pos;  // No strings matched after a span.
            }
            // Match strings from after the next string match.
        } else {
            // The position is after a string match (or a single code point).
            if(offsets.isEmpty()) {
                // No more strings matched after a previous string match.
                // Try another code point span from after the last string match.
                spanLength=spanSet.span(s+pos, rest, USET_SPAN_CONTAINED);
                if( spanLength==rest || // Reached the end of the string, or
                    spanLength==0       // neither strings nor span progressed.
                ) {
                    return pos+spanLength;
                }
                pos+=spanLength;
                rest-=spanLength;
                continue;  // spanLength>0: Match strings from after a span.
            } else {
                // Try to match only one code point from after a string match if some
                // string matched beyond it, so that we try all possible positions
                // and don't overshoot.
                spanLength=spanOne(spanSet, s+pos, rest);
                if(spanLength>0) {
                    if(spanLength==rest) {
                        return length;  // Reached the end of the string.
                    }
                    // Match strings after this code point.
                    // There cannot be any increments below it because UnicodeSet strings
                    // contain multiple code points.
                    pos+=spanLength;
                    rest-=spanLength;
                    offsets.shift(spanLength);
                    spanLength=0;
                    continue;  // Match strings from after a single code point.
                }
                // Match strings from after the next string match.
            }
        }
        int32_t minOffset=offsets.popMinimum();
        pos+=minOffset;
        rest-=minOffset;
        spanLength=0;  // Match strings from after a string match.
    }
}